

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CommandLineInterface::ErrorPrinter::AddErrorOrWarning
          (ErrorPrinter *this,string_view filename,int line,int column,string_view message,
          string_view type,ostream *out)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_b8;
  size_t local_a8;
  char *local_a0;
  size_t local_98;
  char *pcStack_90;
  size_t local_88;
  char *pcStack_80;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  string local_50 [8];
  string dfile;
  ostream *out_local;
  int column_local;
  int line_local;
  ErrorPrinter *this_local;
  string_view filename_local;
  
  dfile.field_2._8_8_ = out;
  std::__cxx11::string::string(local_50);
  if ((this->format_ == ERROR_FORMAT_MSVS) && (this->tree_ != (DiskSourceTree *)0x0)) {
    this_local._0_4_ = (undefined4)filename._M_len;
    this_local._4_4_ = filename._M_len._4_4_;
    filename_local._M_len._0_4_ = filename._M_str._0_4_;
    filename_local._M_len._4_4_ = filename._M_str._4_4_;
    local_68 = this_local._0_4_;
    uStack_64 = this_local._4_4_;
    uStack_60 = (undefined4)filename_local._M_len;
    uStack_5c = filename_local._M_len._4_4_;
    bVar1 = google::protobuf::compiler::DiskSourceTree::VirtualFileToDiskFile
                      (this->tree_,filename._M_len,filename._M_str,local_50);
    if ((bVar1 & 1) != 0) {
      std::operator<<((ostream *)dfile.field_2._8_8_,local_50);
      goto LAB_00172487;
    }
  }
  local_88 = filename._M_len;
  pcStack_80 = filename._M_str;
  std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)dfile.field_2._8_8_,filename);
LAB_00172487:
  if (line != -1) {
    if (this->format_ == ERROR_FORMAT_GCC) {
      poVar3 = std::operator<<((ostream *)dfile.field_2._8_8_,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,line + 1);
      poVar3 = std::operator<<(poVar3,":");
      std::ostream::operator<<(poVar3,column + 1);
    }
    else if (this->format_ == ERROR_FORMAT_MSVS) {
      poVar3 = std::operator<<((ostream *)dfile.field_2._8_8_,"(");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,line + 1);
      poVar3 = std::operator<<(poVar3,") : ");
      local_98 = type._M_len;
      pcStack_90 = type._M_str;
      pbVar4 = std::operator<<(poVar3,type);
      poVar3 = std::operator<<(pbVar4," in column=");
      std::ostream::operator<<(poVar3,column + 1);
    }
  }
  local_a8 = type._M_len;
  local_a0 = type._M_str;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b8,"warning");
  __x._M_str = local_a0;
  __x._M_len = local_a8;
  bVar2 = std::operator==(__x,local_b8);
  if (bVar2) {
    poVar3 = std::operator<<((ostream *)dfile.field_2._8_8_,": warning: ");
    pbVar4 = std::operator<<(poVar3,message);
    std::ostream::operator<<(pbVar4,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar3 = std::operator<<((ostream *)dfile.field_2._8_8_,": ");
    pbVar4 = std::operator<<(poVar3,message);
    std::ostream::operator<<(pbVar4,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void AddErrorOrWarning(absl::string_view filename, int line, int column,
                         absl::string_view message, absl::string_view type,
                         std::ostream& out) {
    std::string dfile;
    if (
#ifndef PROTOBUF_OPENSOURCE
        // Print full path when running under MSVS
        format_ == CommandLineInterface::ERROR_FORMAT_MSVS &&
#endif  // !PROTOBUF_OPENSOURCE
        tree_ != nullptr && tree_->VirtualFileToDiskFile(filename, &dfile)) {
      out << dfile;
    } else {
      out << filename;
    }

    // Users typically expect 1-based line/column numbers, so we add 1
    // to each here.
    if (line != -1) {
      // Allow for both GCC- and Visual-Studio-compatible output.
      switch (format_) {
        case CommandLineInterface::ERROR_FORMAT_GCC:
          out << ":" << (line + 1) << ":" << (column + 1);
          break;
        case CommandLineInterface::ERROR_FORMAT_MSVS:
          out << "(" << (line + 1) << ") : " << type
              << " in column=" << (column + 1);
          break;
      }
    }

    if (type == "warning") {
      out << ": warning: " << message << std::endl;
    } else {
      out << ": " << message << std::endl;
    }
  }